

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::CipherListsEqual
               (SSL_CTX *ctx,
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               *expected)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  OPENSSL_STACK *sk;
  size_t sVar4;
  SSL_CIPHER *c;
  ulong uVar5;
  size_t i;
  ulong i_00;
  long lVar6;
  bool bVar7;
  
  sk = (OPENSSL_STACK *)SSL_CTX_get_ciphers(ctx);
  sVar4 = OPENSSL_sk_num(sk);
  if (sVar4 == (long)(expected->
                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(expected->
                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) {
    lVar6 = 0;
    i_00 = 0;
    do {
      bVar7 = (ulong)((long)(expected->
                            super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(expected->
                            super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) <= i_00;
      if (bVar7) {
        return bVar7;
      }
      c = (SSL_CIPHER *)OPENSSL_sk_value(sk,i_00);
      uVar2 = *(ulong *)((long)&((expected->
                                 super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->id + lVar6);
      uVar5 = SSL_CIPHER_get_id(c);
      if (uVar2 != (uVar5 & 0xffffffff)) {
        return bVar7;
      }
      uVar1 = *(uint *)((long)&((expected->
                                super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                )._M_impl.super__Vector_impl_data._M_start)->in_group_flag + lVar6);
      iVar3 = SSL_CTX_cipher_in_group(ctx,i_00);
      i_00 = i_00 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar1 == (iVar3 != 0));
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool CipherListsEqual(SSL_CTX *ctx,
                             const std::vector<ExpectedCipher> &expected) {
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  if (sk_SSL_CIPHER_num(ciphers) != expected.size()) {
    return false;
  }

  for (size_t i = 0; i < expected.size(); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (expected[i].id != SSL_CIPHER_get_id(cipher) ||
        expected[i].in_group_flag != !!SSL_CTX_cipher_in_group(ctx, i)) {
      return false;
    }
  }

  return true;
}